

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocking_queue.h
# Opt level: O1

iterator * __thiscall
bidfx_public_api::tools::BlockingQueue<int>::Poll
          (iterator *__return_storage_ptr__,BlockingQueue<int> *this,milliseconds duration)

{
  long lVar1;
  long lVar2;
  long lVar3;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_48;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_38;
  
  lVar1 = std::chrono::_V2::steady_clock::now();
  local_48._M_owns = false;
  local_48._M_device = &this->mutex_;
  std::unique_lock<std::mutex>::lock(&local_48);
  local_48._M_owns = true;
  lVar2 = std::chrono::_V2::steady_clock::now();
  if ((this->queue_).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
      _M_finish._M_cur ==
      (this->queue_).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
      _M_start._M_cur) {
    do {
      lVar3 = duration.__r * 1000000 - (lVar2 - lVar1);
      if (lVar3 == 0 || duration.__r * 1000000 < lVar2 - lVar1) break;
      lVar2 = std::chrono::_V2::steady_clock::now();
      local_38.__d.__r = (duration)(lVar3 + lVar2);
      std::condition_variable::
      __wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                (&this->condition_,&local_48,&local_38);
      lVar2 = std::chrono::_V2::steady_clock::now();
    } while ((this->queue_).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur ==
             (this->queue_).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_48);
  Pop(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

typename std::deque<T>::iterator Poll(std::chrono::milliseconds duration)
    {
        {
            std::chrono::steady_clock::time_point start = std::chrono::steady_clock::now();
            std::unique_lock<std::mutex> lock(mutex_);
            std::chrono::nanoseconds elapsed = std::chrono::steady_clock::now() - start;
            while (queue_.empty() && elapsed < duration)
            {
                condition_.wait_for(lock, duration - elapsed);
                elapsed = std::chrono::steady_clock::now() - start;
            }
        }
        return Pop();
    }